

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O2

void TPZShapeHDiv<pzshape::TPZShapeLinear>::ComputeMasterDirections(TPZShapeData *data)

{
  TPZFNMatrix<243,_double> *this;
  int iVar1;
  uint uVar2;
  double *pdVar3;
  int iVar4;
  long col;
  ulong uVar5;
  int side;
  long lVar6;
  bool bVar7;
  double local_118;
  TPZFNMatrix<9,_double> gradx;
  
  this = &data->fMasterDirections;
  TPZFMatrix<double>::Resize(&this->super_TPZFMatrix<double>,3,3);
  local_118 = 0.0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&gradx,3,1,&local_118);
  pdVar3 = TPZFMatrix<double>::operator()(&gradx.super_TPZFMatrix<double>,0,0);
  *pdVar3 = 1.0;
  pztopology::TPZLine::ComputeHDivDirections<double>
            (&gradx.super_TPZFMatrix<double>,&this->super_TPZFMatrix<double>);
  iVar4 = 0;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    uVar2 = pztopology::TPZLine::NContainedSides((int)lVar6);
    col = (long)iVar4;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      iVar1 = (data->fSideOrient).super_TPZVec<int>.fStore[lVar6];
      pdVar3 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,0,col);
      *pdVar3 = (double)iVar1 * *pdVar3;
      col = col + 1;
    }
    iVar4 = iVar4 + uVar2;
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradx);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeMasterDirections(TPZShapeData &data)
{
    int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    data.fMasterDirections.Resize(3,numvec);
    TPZFNMatrix<9,REAL> gradx(3,TSHAPE::Dimension,0.);
    for (int i = 0; i < TSHAPE::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TSHAPE::ComputeHDivDirections(gradx, data.fMasterDirections);
    
    int firstface = TSHAPE::NSides - TSHAPE::NFacets - 1;
    int lastface = TSHAPE::NSides - 1;
    int cont = 0;
    for(int side = firstface; side < lastface; side++)
    {
        int nvec = TSHAPE::NContainedSides(side);
        for (int ivet = 0; ivet<nvec; ivet++)
        {
            for (int il = 0; il<dim; il++)
            {
              data.fMasterDirections(il,ivet+cont) *= data.fSideOrient[side-firstface];
            }
        }
        cont += nvec;
    }
    
}